

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

bool __thiscall cmTarget::IsExecutableWithExports(cmTarget *this)

{
  bool bVar1;
  char *val;
  string local_38;
  
  if (this->TargetTypeValue == EXECUTABLE) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"ENABLE_EXPORTS","");
    val = GetProperty(this,&local_38);
    bVar1 = cmSystemTools::IsOn(val);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmTarget::IsExecutableWithExports() const
{
  return (this->GetType() == cmStateEnums::EXECUTABLE &&
          this->GetPropertyAsBool("ENABLE_EXPORTS"));
}